

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

void __thiscall
icu_63::RegexMatcher::setStackLimit(RegexMatcher *this,int32_t limit,UErrorCode *status)

{
  UBool UVar1;
  int32_t local_24;
  int32_t adjustedLimit;
  UErrorCode *status_local;
  int32_t limit_local;
  RegexMatcher *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = ::U_FAILURE(this->fDeferredStatus);
    if (UVar1 == '\0') {
      if (limit < 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        reset(this);
        if (limit == 0) {
          UVector64::setMaxCapacity(this->fStack,0);
        }
        else {
          local_24 = (int32_t)((ulong)(long)limit >> 2);
          if (local_24 < this->fPattern->fFrameSize) {
            local_24 = this->fPattern->fFrameSize;
          }
          UVector64::setMaxCapacity(this->fStack,local_24);
        }
        this->fStackLimit = limit;
      }
    }
    else {
      *status = this->fDeferredStatus;
    }
  }
  return;
}

Assistant:

void RegexMatcher::setStackLimit(int32_t limit, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return;
    }
    if (limit < 0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    // Reset the matcher.  This is needed here in case there is a current match
    //    whose final stack frame (containing the match results, pointed to by fFrame)
    //    would be lost by resizing to a smaller stack size.
    reset();

    if (limit == 0) {
        // Unlimited stack expansion
        fStack->setMaxCapacity(0);
    } else {
        // Change the units of the limit  from bytes to ints, and bump the size up
        //   to be big enough to hold at least one stack frame for the pattern,
        //   if it isn't there already.
        int32_t adjustedLimit = limit / sizeof(int32_t);
        if (adjustedLimit < fPattern->fFrameSize) {
            adjustedLimit = fPattern->fFrameSize;
        }
        fStack->setMaxCapacity(adjustedLimit);
    }
    fStackLimit = limit;
}